

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O2

void __thiscall
CommandPlayerType::Tick
          (CommandPlayerType *this,SBarInfoMainBlock *block,DSBarInfo *statusBar,bool hudChanged)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  
  SBarInfoCommandFlowControl::Tick
            (&this->super_SBarInfoCommandFlowControl,block,statusBar,hudChanged);
  if (((statusBar->super_DBaseStatusBar).CPlayer)->cls == (PClassPlayerPawn *)0x0) {
    return;
  }
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    uVar4 = (ulong)(this->classes).Count;
    if (uVar4 <= uVar3) break;
    bVar2 = PClass::IsAncestorOf
                      ((this->classes).Array[uVar3],
                       (PClass *)((statusBar->super_DBaseStatusBar).CPlayer)->cls);
    uVar1 = uVar3 + 1;
  } while (!bVar2);
  SBarInfoCommandFlowControl::SetTruth
            (&this->super_SBarInfoCommandFlowControl,uVar3 < uVar4,block,statusBar);
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			SBarInfoCommandFlowControl::Tick(block, statusBar, hudChanged);

			if(statusBar->CPlayer->cls == NULL)
				return; //No class so we can not continue
		
			for(unsigned int i = 0;i < classes.Size();i++)
			{
				if (statusBar->CPlayer->cls->IsDescendantOf(classes[i]))
				{
					SetTruth(true, block, statusBar);
					return;
				}
			}
			SetTruth(false, block, statusBar);
		}